

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O1

void __thiscall
Volume::visualizeVisualSpace
          (Volume *this,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *_obstcs,Vector2d *obs,Mat *dst)

{
  Object *pOVar1;
  Mat *src;
  undefined8 uVar2;
  Object *obj;
  Object *this_00;
  Volume *this_01;
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 uStack_f8;
  undefined4 local_f0 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_b8;
  Mat *local_b0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  polygons;
  Vector2d local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  Rect local_58;
  Rect local_48;
  
  this_01 = (Volume *)local_108;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(polygons.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
  local_48 = walls;
  local_d8 = 0x4024000000000000;
  uStack_d0 = 0x4024000000000000;
  local_c8 = 0x4024000000000000;
  uStack_c0 = 0;
  local_b8 = _obstcs;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)dst;
  cv::rectangle(&polygons,&local_48,&local_d8,0xffffffff,8,0);
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(polygons.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
  local_58 = floors;
  local_d8 = 0x4044000000000000;
  uStack_d0 = 0x4044000000000000;
  local_c8 = 0x4044000000000000;
  uStack_c0 = 0;
  local_b0 = dst;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)dst;
  cv::rectangle(&polygons,&local_58,&local_d8,0xffffffff,8,0);
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = *(Object **)(this + 0x20);
  pOVar1 = *(Object **)(this + 0x28);
  if (this_00 != pOVar1) {
    do {
      local_88.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[0];
      local_88.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
      Object::makePolygons4Render(this_00,&local_88,&polygons);
      this_00 = this_00 + 1;
    } while (this_00 != pOVar1);
  }
  src = local_b0;
  uStack_f8 = 0;
  local_108[0] = 0x3010000;
  local_100 = local_b0;
  local_e0 = 0;
  local_f0[0] = 0x8104000c;
  local_d8 = 0x406fc00000000000;
  uStack_d0 = 0x406fc00000000000;
  local_c8 = 0x406fc00000000000;
  uStack_c0 = 0;
  local_e8 = &polygons;
  uVar2 = cv::noArray();
  local_60 = 0;
  cv::drawContours(local_108,local_f0,0xffffffff,&local_d8,0xffffffff,8,uVar2,0x7fffffff,&local_60);
  uStack_f8 = 0;
  local_108[0] = 0x3010000;
  local_100 = src;
  local_e0 = 0;
  local_f0[0] = 0x8104000c;
  local_e8 = local_b8;
  local_d8 = 0x4024000000000000;
  uStack_d0 = 0x4024000000000000;
  local_c8 = 0x4024000000000000;
  uStack_c0 = 0;
  uVar2 = cv::noArray();
  local_68 = 0;
  cv::drawContours(local_108,local_f0,0xffffffff,&local_d8,0xffffffff,8,uVar2,0x7fffffff,&local_68);
  prettier(this_01,src,obs);
  uStack_f8 = 0;
  local_108[0] = 0x3010000;
  local_100 = src;
  local_70 = CONCAT44((int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                           m_storage.m_data.array[1],
                      (int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                           m_storage.m_data.array[0]);
  local_d8 = 0;
  uStack_d0 = 0x406fe00000000000;
  local_c8 = 0x406fe00000000000;
  uStack_c0 = 0;
  cv::circle(local_108,&local_70,4,&local_d8,0xffffffff,8,0);
  uStack_f8 = 0;
  local_108[0] = 0x3010000;
  local_100 = src;
  local_78 = CONCAT44((int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                           m_storage.m_data.array[1],
                      (int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                           m_storage.m_data.array[0]);
  local_d8 = 0x4044000000000000;
  uStack_d0 = 0x4044000000000000;
  local_c8 = 0x4044000000000000;
  uStack_c0 = 0;
  cv::circle(local_108,&local_78,7,&local_d8,2,8,0);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&polygons);
  return;
}

Assistant:

void Volume::visualizeVisualSpace(const std::vector<Obstacle>& _obstcs, const Eigen::Vector2d& obs, cv::Mat& dst) const {
    cv::rectangle(dst, walls, cv::Scalar(10, 10, 10), -1);
    cv::rectangle(dst, floors, cv::Scalar(40, 40, 40), -1);
    std::vector<std::vector<cv::Point>> polygons;
    for (const Object& obj: objs)
        obj.makePolygons4Render(obs, polygons);
    cv::drawContours(dst, polygons, -1, cv::Scalar(254, 254, 254), -1);
    cv::drawContours(dst, _obstcs, -1, cv::Scalar(10, 10, 10), -1);
    prettier(dst, obs);
    cv::circle(dst, cv::Point(obs.x(), obs.y()), 4, cv::Scalar(0, 255, 255), -1);
    cv::circle(dst, cv::Point(obs.x(), obs.y()), 7, cv::Scalar(40, 40, 40), 2);
}